

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *vQueue,Nwk_Obj_t *pObj,int iCurrent,int fArrival)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void **ppvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  Vec_PtrPush(vQueue,pObj);
  iVar1 = vQueue->nSize;
  lVar7 = (long)(iCurrent + 1);
  lVar6 = (long)iVar1;
  while (lVar8 = lVar6 + -1, lVar7 < lVar8) {
    ppvVar4 = vQueue->pArray;
    pvVar5 = ppvVar4[lVar6 + -2];
    iVar2 = *(int *)((long)pvVar5 + 0x2c);
    iVar3 = *(int *)((long)ppvVar4[lVar8] + 0x2c);
    if (fArrival == 0) {
      if (iVar3 <= iVar2) break;
    }
    else if (iVar2 <= iVar3) break;
    ppvVar4[lVar6 + -2] = ppvVar4[lVar8];
    vQueue->pArray[lVar8] = pvVar5;
    lVar6 = lVar8;
  }
  do {
    if ((long)iVar1 + -1 <= lVar7) {
      return;
    }
    iVar2 = *(int *)((long)vQueue->pArray[lVar7] + 0x2c);
    iVar3 = *(int *)((long)vQueue->pArray[lVar7 + 1] + 0x2c);
    if (fArrival == 0) {
      if (iVar2 < iVar3) {
        __assert_fail("Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                      ,0x223,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
      }
    }
    else if (iVar3 < iVar2) {
      __assert_fail("Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkTiming.c"
                    ,0x221,"void Nwk_NodeUpdateAddToQueue(Vec_Ptr_t *, Nwk_Obj_t *, int, int)");
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

void Nwk_NodeUpdateAddToQueue( Vec_Ptr_t * vQueue, Nwk_Obj_t * pObj, int iCurrent, int fArrival )
{
    Nwk_Obj_t * pTemp1, * pTemp2;
    int i;
    Vec_PtrPush( vQueue, pObj );
    for ( i = Vec_PtrSize(vQueue) - 1; i > iCurrent + 1; i-- )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i-1];
        if ( fArrival )
        {
            if ( Nwk_ObjLevel(pTemp2) <= Nwk_ObjLevel(pTemp1) )
                break;
        }
        else
        {
            if ( Nwk_ObjLevel(pTemp2) >= Nwk_ObjLevel(pTemp1) )
                break;
        }
        vQueue->pArray[i-1] = pTemp1;
        vQueue->pArray[i]   = pTemp2;
    }
    // verification
    for ( i = iCurrent + 1; i < Vec_PtrSize(vQueue) - 1; i++ )
    {
        pTemp1 = (Nwk_Obj_t *)vQueue->pArray[i];
        pTemp2 = (Nwk_Obj_t *)vQueue->pArray[i+1];
        if ( fArrival )
            assert( Nwk_ObjLevel(pTemp1) <= Nwk_ObjLevel(pTemp2) );
        else
            assert( Nwk_ObjLevel(pTemp1) >= Nwk_ObjLevel(pTemp2) );
    }
}